

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O1

SymmetricMatrix * __thiscall
sptk::SymmetricMatrix::operator=(SymmetricMatrix *this,SymmetricMatrix *matrix)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  if (this != matrix) {
    this->num_dimension_ = matrix->num_dimension_;
    std::vector<double,_std::allocator<double>_>::operator=(&this->data_,&matrix->data_);
    std::vector<double_*,_std::allocator<double_*>_>::resize
              (&this->index_,(long)this->num_dimension_);
    iVar1 = this->num_dimension_;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar2] =
             (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + uVar3;
        lVar2 = lVar2 + 1;
        uVar3 = uVar3 + (int)lVar2;
      } while (iVar1 != lVar2);
    }
  }
  return this;
}

Assistant:

SymmetricMatrix& SymmetricMatrix::operator=(const SymmetricMatrix& matrix) {
  if (this != &matrix) {
    num_dimension_ = matrix.num_dimension_;
    data_ = matrix.data_;
    index_.resize(num_dimension_);

    for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
      index_[i] = &data_[j];
    }
  }
  return *this;
}